

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cc
# Opt level: O0

void __thiscall
Database::DatabaseImpl::GetTraffic
          (DatabaseImpl *this,string *port,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *time,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *traffic)

{
  undefined8 this_00;
  bool bVar1;
  socklen_t __len;
  Column local_130;
  string local_110;
  Column local_f0;
  string local_d0;
  undefined1 local_a0 [8];
  Statement query;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *traffic_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *time_local;
  string *port_local;
  DatabaseImpl *this_local;
  
  __len = (socklen_t)traffic;
  query._112_8_ = traffic;
  SQLite::Statement::Statement
            ((Statement *)local_a0,&this->db_,"SELECT * FROM traffic WHERE port = @port");
  SQLite::Statement::bind((Statement *)local_a0,0x1ba143,(sockaddr *)port,__len);
  while( true ) {
    bVar1 = SQLite::Statement::executeStep((Statement *)local_a0);
    if (!bVar1) break;
    SQLite::Statement::getColumn(&local_f0,(Statement *)local_a0,1);
    SQLite::Column::operator_cast_to_string(&local_d0,&local_f0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(time,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    SQLite::Column::~Column(&local_f0);
    this_00 = query._112_8_;
    SQLite::Statement::getColumn(&local_130,(Statement *)local_a0,2);
    SQLite::Column::operator_cast_to_string(&local_110,&local_130);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_00,&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    SQLite::Column::~Column(&local_130);
  }
  SQLite::Statement::~Statement((Statement *)local_a0);
  return;
}

Assistant:

void Database::DatabaseImpl::GetTraffic(const string& port, vector<string>& time, vector<string>& traffic)
{
    SQLite::Statement query(db_, "SELECT * FROM traffic WHERE port = @port");
    query.bind("@port", port);
    while(query.executeStep()) {
        time.push_back(query.getColumn(1));
        traffic.push_back(query.getColumn(2));
    }
}